

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fit_model.hpp
# Opt level: O3

int add_tree_internal<float,unsigned_long,long_double>
              (IsoForest *model_outputs,ExtIsoForest *model_outputs_ext,float *numeric_data,
              size_t ncols_numeric,int *categ_data,size_t ncols_categ,int *ncat,float *Xc,
              unsigned_long *Xc_ind,unsigned_long *Xc_indptr,size_t ndim,size_t ntry,
              CoefType coef_type,bool coef_by_prop,float *sample_weights,size_t nrows,
              size_t max_depth,size_t ncols_per_tree,bool limit_depth,bool penalize_range,
              bool standardize_data,bool fast_bratio,float *col_weights,bool weigh_by_kurt,
              double prob_pick_by_gain_pl,double prob_pick_by_gain_avg,double prob_pick_by_full_gain
              ,double prob_pick_by_dens,double prob_pick_col_by_range,double prob_pick_col_by_var,
              double prob_pick_col_by_kurt,double min_gain,MissingAction missing_action,
              CategSplit cat_split_type,NewCategAction new_cat_action,UseDepthImp depth_imp,
              WeighImpRows weigh_imp_rows,bool all_perm,Imputer *imputer,size_t min_imp_obs,
              TreesIndexer *indexer,float *ref_numeric_data,int *ref_categ_data,
              bool ref_is_col_major,size_t ref_ld_numeric,size_t ref_ld_categ,float *ref_Xc,
              unsigned_long *ref_Xc_ind,unsigned_long *ref_Xc_indptr,uint64_t random_seed)

{
  pointer *ppSVar1;
  iterator __position;
  iterator __position_00;
  pointer pvVar2;
  pointer pvVar3;
  pointer pSVar4;
  pointer puVar5;
  pointer puVar6;
  WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float> *this;
  pointer *ppvVar7;
  ExtIsoForest *pEVar8;
  double *output_depths;
  runtime_error *this_00;
  size_t sVar9;
  iterator __position_01;
  vector<IsoHPlane,_std::allocator<IsoHPlane>_> *hplane_root;
  size_t *n_terminal;
  vector<IsoTree,_std::allocator<IsoTree>_> *tree_root;
  pointer pSVar10;
  pointer __old_p;
  vector<ImputeNode,_std::allocator<ImputeNode>_> *impute_nodes;
  pointer pvVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  ModelParams model_params;
  TreesIndexer *local_320;
  SignalSwitcher local_308;
  _Head_base<0UL,_WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>_*,_false>
  local_2f8;
  size_t local_2f0;
  float *local_2e8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_2e0;
  double local_2c8;
  double local_2c0;
  double local_2b8;
  double local_2b0;
  double local_2a8;
  double local_2a0;
  double local_298;
  double local_290;
  ExtIsoForest local_288;
  ModelParams local_240;
  InputData<float,_unsigned_long> local_180;
  
  local_2e8 = numeric_data;
  if (((((prob_pick_by_gain_pl < 0.0) || (prob_pick_by_gain_avg < 0.0)) ||
       (prob_pick_by_full_gain < 0.0)) ||
      ((prob_pick_by_dens < 0.0 || (prob_pick_col_by_range < 0.0)))) ||
     ((prob_pick_col_by_var < 0.0 || (prob_pick_col_by_kurt < 0.0)))) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Cannot pass negative probabilities.\n");
LAB_0030ff1f:
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((ncols_categ != 0) && ((prob_pick_col_by_range != 0.0 || (NAN(prob_pick_col_by_range))))) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"\'prob_pick_col_by_range\' is not compatible with categorical data.\n");
    goto LAB_0030ff1f;
  }
  if ((ncols_categ != 0) && ((prob_pick_by_full_gain != 0.0 || (NAN(prob_pick_by_full_gain))))) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"\'prob_pick_by_full_gain\' is not compatible with categorical data.\n");
    goto LAB_0030ff1f;
  }
  if (weigh_by_kurt && prob_pick_col_by_kurt != 0.0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"\'weigh_by_kurt\' and \'prob_pick_col_by_kurt\' cannot be used together.\n")
    ;
    goto LAB_0030ff1f;
  }
  if (model_outputs == (IsoForest *)0x0 && ndim == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Must pass \'ndim>0\' in the extended model.\n");
    goto LAB_0030ff1f;
  }
  if ((((indexer != (TreesIndexer *)0x0) &&
       (pSVar10 = (indexer->indices).
                  super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                  super__Vector_impl_data._M_start,
       pSVar10 !=
       (indexer->indices).super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
       _M_impl.super__Vector_impl_data._M_finish)) &&
      ((pSVar10->reference_points).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       (pSVar10->reference_points).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
       ._M_impl.super__Vector_impl_data._M_finish)) &&
     ((ref_numeric_data == (float *)0x0 && ref_categ_data == (int *)0x0) &&
      ref_Xc_indptr == (unsigned_long *)0x0)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,
               "\'indexer\' has reference points. Those points must be passed to index them in the new tree to add.\n"
              );
    goto LAB_0030ff1f;
  }
  if (ncols_categ == 0) {
    local_180.max_categ = 0;
  }
  else {
    sVar9 = 0;
    local_180.max_categ = 0;
    do {
      if (local_180.max_categ < ncat[sVar9]) {
        local_180.max_categ = ncat[sVar9];
      }
      sVar9 = sVar9 + 1;
    } while (ncols_categ != sVar9);
  }
  local_180.ncols_tot = ncols_categ + ncols_numeric;
  uVar13 = ntry;
  if (local_180.ncols_tot < ntry) {
    uVar13 = local_180.ncols_tot;
  }
  if (model_outputs == (IsoForest *)0x0) {
    uVar13 = ntry;
  }
  if (ncols_per_tree == 0) {
    ncols_per_tree = local_180.ncols_tot;
  }
  if (indexer == (TreesIndexer *)0x0) {
    local_320 = (TreesIndexer *)0x0;
  }
  else {
    local_320 = (TreesIndexer *)0x0;
    if ((indexer->indices).super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (indexer->indices).super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      local_320 = indexer;
    }
  }
  local_180.ncat = ncat;
  local_180.nrows = nrows;
  local_180.sample_weights = sample_weights;
  local_180.weight_as_sample = false;
  local_180.col_weights = col_weights;
  local_180.Xc = Xc;
  local_180.Xc_ind = Xc_ind;
  local_180.Xc_indptr = Xc_indptr;
  local_2f0 = ncols_numeric;
  local_2c8 = prob_pick_by_gain_avg;
  local_2c0 = prob_pick_by_gain_pl;
  local_2b8 = prob_pick_by_dens;
  local_2b0 = prob_pick_col_by_range;
  local_2a8 = prob_pick_col_by_var;
  local_2a0 = prob_pick_col_by_kurt;
  local_298 = min_gain;
  local_290 = prob_pick_by_full_gain;
  local_180.numeric_data = numeric_data;
  local_180.ncols_numeric = ncols_numeric;
  local_180.categ_data = categ_data;
  local_180.ncols_categ = ncols_categ;
  memset(&local_180.log2_n,0,0xe0);
  local_240.max_depth = nrows - 1;
  if (max_depth != 0) {
    local_240.max_depth = max_depth;
  }
  local_240.ndim = 0;
  if (model_outputs == (IsoForest *)0x0) {
    local_240.ndim = ndim;
  }
  local_240.with_replacement = false;
  local_240.sample_size = nrows;
  local_240.ntrees = 1;
  local_240.penalize_range = penalize_range;
  local_240.standardize_data = standardize_data;
  local_240.random_seed = random_seed;
  local_240.weigh_by_kurt = weigh_by_kurt;
  local_240.prob_pick_by_gain_avg = local_2c8;
  local_240.prob_pick_by_gain_pl = local_2c0;
  local_240.prob_pick_by_full_gain = local_290;
  local_240.prob_pick_by_dens = local_2b8;
  local_240.prob_pick_col_by_range = local_2b0;
  local_240.prob_pick_col_by_var = local_2a8;
  local_240.prob_pick_col_by_kurt = local_2a0;
  local_240.min_gain = local_298;
  local_240.cat_split_type = cat_split_type;
  local_240.new_cat_action = new_cat_action;
  local_240.missing_action = missing_action;
  pEVar8 = (ExtIsoForest *)model_outputs;
  if (model_outputs == (IsoForest *)0x0) {
    pEVar8 = model_outputs_ext;
  }
  local_240.scoring_metric = pEVar8->scoring_metric;
  local_240.fast_bratio = fast_bratio;
  local_240.all_perm = all_perm;
  local_240.coef_type = coef_type;
  local_240.coef_by_prop = coef_by_prop;
  local_240.calc_dist = false;
  local_240.calc_depth = false;
  local_240.impute_at_fit = false;
  local_240.depth_imp = depth_imp;
  local_240.weigh_imp_rows = weigh_imp_rows;
  local_240.min_imp_obs = min_imp_obs;
  local_240.ncols_per_tree = ncols_per_tree;
  local_240.ntry = uVar13;
  if ((local_290 != 0.0) || (NAN(local_290))) {
    if (Xc_indptr == (unsigned_long *)0x0) {
      colmajor_to_rowmajor<float>(local_2e8,nrows,local_2f0,&local_180.X_row_major);
    }
    else {
      colmajor_to_rowmajor<float,unsigned_long>
                (Xc,Xc_ind,Xc_indptr,nrows,local_2f0,&local_180.Xr,&local_180.Xr_ind,
                 &local_180.Xr_indptr);
    }
  }
  this = (WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float> *)
         operator_new(0x800);
  memset(this,0,0x800);
  WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>::WorkerMemory(this);
  local_2f8._M_head_impl = this;
  if (model_outputs == (IsoForest *)0x0) {
    __position_01._M_current =
         (model_outputs_ext->hplanes).
         super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    lVar12 = (long)__position_01._M_current -
             (long)(model_outputs_ext->hplanes).
                   super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    pEVar8 = model_outputs_ext;
    if (__position_01._M_current ==
        (model_outputs_ext->hplanes).
        super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
      ::_M_realloc_insert<>(&model_outputs_ext->hplanes,__position_01);
      goto LAB_0030f8fc;
    }
  }
  else {
    __position_01._M_current =
         (vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)
         (model_outputs->trees).
         super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    lVar12 = (long)__position_01._M_current -
             (long)(model_outputs->trees).
                   super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    pEVar8 = (ExtIsoForest *)model_outputs;
    if (__position_01._M_current ==
        (vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)
        (model_outputs->trees).
        super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
      ::_M_realloc_insert<>(&model_outputs->trees,(iterator)__position_01._M_current);
      goto LAB_0030f8fc;
    }
  }
  ppvVar7 = &(pEVar8->hplanes).
             super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  ((__position_01._M_current)->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ((__position_01._M_current)->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ((__position_01._M_current)->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *ppvVar7 = *ppvVar7 + 1;
LAB_0030f8fc:
  if (imputer == (Imputer *)0x0) {
    impute_nodes = (vector<ImputeNode,_std::allocator<ImputeNode>_> *)0x0;
  }
  else {
    __position._M_current =
         (imputer->imputer_tree).
         super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (imputer->imputer_tree).
        super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
      ::_M_realloc_insert<>(&imputer->imputer_tree,__position);
      pvVar11 = (imputer->imputer_tree).
                super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      ((__position._M_current)->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      ((__position._M_current)->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      ((__position._M_current)->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pvVar11 = (imputer->imputer_tree).
                super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + 1;
      (imputer->imputer_tree).
      super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pvVar11;
    }
    impute_nodes = pvVar11 + -1;
  }
  if (local_320 != (TreesIndexer *)0x0) {
    __position_00._M_current =
         (local_320->indices).super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position_00._M_current ==
        (local_320->indices).super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::_M_realloc_insert<>
                (&local_320->indices,__position_00);
    }
    else {
      memset(__position_00._M_current,0,0x98);
      ppSVar1 = &(local_320->indices).
                 super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppSVar1 = *ppSVar1 + 1;
    }
  }
  bVar15 = handle_is_locked == false;
  if (bVar15) {
    handle_is_locked = true;
    interrupt_switch = false;
    local_308.old_sig = (sig_t_)signal(2,set_interrup_global_variable);
  }
  local_308.is_active = bVar15;
  check_interrupt_switch(&local_308);
  if (model_outputs == (IsoForest *)0x0) {
    tree_root = (vector<IsoTree,_std::allocator<IsoTree>_> *)0x0;
  }
  else {
    tree_root = (model_outputs->trees).
                super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + -1;
  }
  if (model_outputs_ext == (ExtIsoForest *)0x0) {
    hplane_root = (vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)0x0;
  }
  else {
    hplane_root = (model_outputs_ext->hplanes).
                  super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -1;
  }
  fit_itree<InputData<float,unsigned_long>,WorkerMemory<ImputedData<unsigned_long,long_double>,long_double,float>,long_double>
            (tree_root,hplane_root,local_2f8._M_head_impl,&local_180,&local_240,impute_nodes,
             (lVar12 >> 3) * -0x5555555555555555);
  check_interrupt_switch(&local_308);
  if (model_outputs == (IsoForest *)0x0) {
    pvVar3 = (model_outputs_ext->hplanes).
             super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pEVar8 = model_outputs_ext;
    if (pvVar3[-1].super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage !=
        pvVar3[-1].super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::__shrink_to_fit_aux<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_true>::_S_do_it
                (pvVar3 + -1);
    }
  }
  else {
    pvVar2 = (model_outputs->trees).
             super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pEVar8 = (ExtIsoForest *)model_outputs;
    if (pvVar2[-1].super__Vector_base<IsoTree,_std::allocator<IsoTree>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage !=
        pvVar2[-1].super__Vector_base<IsoTree,_std::allocator<IsoTree>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::__shrink_to_fit_aux<std::vector<IsoTree,_std::allocator<IsoTree>_>,_true>::_S_do_it
                (pvVar2 + -1);
    }
  }
  pEVar8->has_range_penalty = (bool)(pEVar8->has_range_penalty | penalize_range);
  if ((imputer != (Imputer *)0x0) &&
     (pvVar11 = (imputer->imputer_tree).
                super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish,
     pvVar11[-1].super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>._M_impl.
     super__Vector_impl_data._M_end_of_storage !=
     pvVar11[-1].super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>._M_impl.
     super__Vector_impl_data._M_finish)) {
    std::__shrink_to_fit_aux<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_true>::_S_do_it
              (pvVar11 + -1);
  }
  if (local_320 != (TreesIndexer *)0x0) {
    pSVar4 = (local_320->indices).
             super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pSVar10 = pSVar4 + -1;
    n_terminal = &pSVar4[-1].n_terminal;
    if (model_outputs == (IsoForest *)0x0) {
      build_terminal_node_mappings_single_tree
                (&pSVar10->terminal_node_mappings,n_terminal,
                 (model_outputs_ext->hplanes).
                 super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1);
    }
    else {
      build_terminal_node_mappings_single_tree
                (&pSVar10->terminal_node_mappings,n_terminal,
                 (model_outputs->trees).
                 super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1);
    }
    check_interrupt_switch(&local_308);
    pSVar10 = (local_320->indices).
              super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (*(pointer *)
         &(pSVar10->node_distances).super__Vector_base<double,_std::allocator<double>_>._M_impl !=
        *(pointer *)
         ((long)&(pSVar10->node_distances).super__Vector_base<double,_std::allocator<double>_> + 8))
    {
      local_288.hplanes.
      super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_288.hplanes.
      super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_288.hplanes.
      super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_288,
                 (local_320->indices).
                 super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1].n_terminal);
      pSVar10 = (local_320->indices).
                super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (model_outputs == (IsoForest *)0x0) {
        build_dindex((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_288,
                     &pSVar10[-1].terminal_node_mappings,&pSVar10[-1].node_distances,
                     &pSVar10[-1].node_depths,pSVar10[-1].n_terminal,
                     (model_outputs_ext->hplanes).
                     super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + -1);
      }
      else {
        build_dindex((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_288,
                     &pSVar10[-1].terminal_node_mappings,&pSVar10[-1].node_distances,
                     &pSVar10[-1].node_depths,pSVar10[-1].n_terminal,
                     (model_outputs->trees).
                     super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + -1);
      }
      if (local_288.hplanes.
          super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_288.hplanes.
                        super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_288.hplanes.
                              super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_288.hplanes.
                              super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    check_interrupt_switch(&local_308);
    pSVar10 = (local_320->indices).
              super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar5 = *(pointer *)
              &(pSVar10->reference_points).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl;
    puVar6 = *(pointer *)
              ((long)&(pSVar10->reference_points).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> + 8);
    if (puVar5 != puVar6) {
      uVar14 = (long)puVar6 - (long)puVar5;
      uVar13 = (long)uVar14 >> 3;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_2e0,uVar13,(allocator_type *)&local_288);
      output_depths = (double *)operator_new__(-(ulong)(uVar13 >> 0x3d != 0) | uVar14);
      if (model_outputs == (IsoForest *)0x0) {
        local_288.hplanes.
        super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_288.hplanes.
        super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_288.hplanes.
        super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_288.new_cat_action = model_outputs_ext->new_cat_action;
        local_288.cat_split_type = model_outputs_ext->cat_split_type;
        local_288.missing_action = model_outputs_ext->missing_action;
        std::
        vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
        ::push_back(&local_288.hplanes,
                    (model_outputs_ext->hplanes).
                    super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish + -1);
        predict_iforest<float,unsigned_long>
                  (ref_numeric_data,ref_categ_data,ref_is_col_major,ref_ld_numeric,ref_ld_categ,
                   ref_Xc,ref_Xc_ind,ref_Xc_indptr,(float *)0x0,(unsigned_long *)0x0,
                   (unsigned_long *)0x0,uVar13,1,false,(IsoForest *)0x0,&local_288,output_depths,
                   local_2e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start,(double *)0x0,local_320);
        std::
        vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
        ::~vector(&local_288.hplanes);
      }
      else {
        local_288.hplanes.
        super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_288.hplanes.
        super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_288.hplanes.
        super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_288.new_cat_action = model_outputs->new_cat_action;
        local_288.cat_split_type = model_outputs->cat_split_type;
        local_288.missing_action = model_outputs->missing_action;
        std::
        vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
        ::push_back((vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                     *)&local_288,
                    (model_outputs->trees).
                    super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish + -1);
        predict_iforest<float,unsigned_long>
                  (ref_numeric_data,ref_categ_data,ref_is_col_major,ref_ld_numeric,ref_ld_categ,
                   ref_Xc,ref_Xc_ind,ref_Xc_indptr,(float *)0x0,(unsigned_long *)0x0,
                   (unsigned_long *)0x0,uVar13,1,false,(IsoForest *)&local_288,(ExtIsoForest *)0x0,
                   output_depths,
                   local_2e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start,(double *)0x0,local_320);
        std::
        vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
        ::~vector((vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                   *)&local_288);
      }
      operator_delete__(output_depths);
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_assign_aux<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)
                 &(local_320->indices).
                  super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1].reference_points,
                 local_2e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start,
                 local_2e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish);
      pSVar10 = (local_320->indices).
                super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (pSVar10[-1].reference_points.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage !=
          pSVar10[-1].reference_points.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::__shrink_to_fit_aux<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true>::
        _S_do_it(&pSVar10[-1].reference_points);
        pSVar10 = (local_320->indices).
                  super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      build_ref_node(pSVar10 + -1);
      if (local_2e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
        operator_delete(local_2e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_2e0.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2e0.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    check_interrupt_switch(&local_308);
  }
  if ((local_308.is_active == true) && (handle_is_locked == true)) {
    interrupt_switch = false;
    signal(2,(__sighandler_t)local_308.old_sig);
    handle_is_locked = false;
  }
  std::
  unique_ptr<WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>,_std::default_delete<WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>_>_>
  ::~unique_ptr((unique_ptr<WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>,_std::default_delete<WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>_>_>
                 *)&local_2f8);
  InputData<float,_unsigned_long>::~InputData(&local_180);
  return 0;
}

Assistant:

int add_tree_internal(
             IsoForest *model_outputs, ExtIsoForest *model_outputs_ext,
             real_t numeric_data[],  size_t ncols_numeric,
             int    categ_data[],    size_t ncols_categ,    int ncat[],
             real_t Xc[], sparse_ix Xc_ind[], sparse_ix Xc_indptr[],
             size_t ndim, size_t ntry, CoefType coef_type, bool coef_by_prop,
             real_t sample_weights[], size_t nrows,
             size_t max_depth,     size_t ncols_per_tree,
             bool   limit_depth,   bool penalize_range, bool standardize_data,
             bool   fast_bratio,
             real_t col_weights[], bool weigh_by_kurt,
             double prob_pick_by_gain_pl, double prob_pick_by_gain_avg,
             double prob_pick_by_full_gain, double prob_pick_by_dens,
             double prob_pick_col_by_range, double prob_pick_col_by_var,
             double prob_pick_col_by_kurt,
             double min_gain, MissingAction missing_action,
             CategSplit cat_split_type, NewCategAction new_cat_action,
             UseDepthImp depth_imp, WeighImpRows weigh_imp_rows,
             bool   all_perm, Imputer *imputer, size_t min_imp_obs,
             TreesIndexer *indexer,
             real_t ref_numeric_data[], int ref_categ_data[],
             bool ref_is_col_major, size_t ref_ld_numeric, size_t ref_ld_categ,
             real_t ref_Xc[], sparse_ix ref_Xc_ind[], sparse_ix ref_Xc_indptr[],
             uint64_t random_seed)
{
    if (
        prob_pick_by_gain_avg  < 0  || prob_pick_by_gain_pl  < 0 ||
        prob_pick_by_full_gain < 0  || prob_pick_by_dens     < 0 ||
        prob_pick_col_by_range < 0  ||
        prob_pick_col_by_var   < 0  || prob_pick_col_by_kurt < 0
    ) {
        throw std::runtime_error("Cannot pass negative probabilities.\n");
    }
    if (prob_pick_col_by_range && ncols_categ)
        throw std::runtime_error("'prob_pick_col_by_range' is not compatible with categorical data.\n");
    if (prob_pick_by_full_gain && ncols_categ)
        throw std::runtime_error("'prob_pick_by_full_gain' is not compatible with categorical data.\n");
    if (prob_pick_col_by_kurt && weigh_by_kurt)
        throw std::runtime_error("'weigh_by_kurt' and 'prob_pick_col_by_kurt' cannot be used together.\n");
    if (ndim == 0 && model_outputs == NULL)
        throw std::runtime_error("Must pass 'ndim>0' in the extended model.\n");
    if (indexer != NULL && !indexer->indices.empty() && !indexer->indices.front().reference_points.empty()) {
        if (ref_numeric_data == NULL && ref_categ_data == NULL && ref_Xc_indptr == NULL)
            throw std::runtime_error("'indexer' has reference points. Those points must be passed to index them in the new tree to add.\n");
    }

    std::vector<ImputeNode> *impute_nodes = NULL;

    int max_categ = 0;
    for (size_t col = 0; col < ncols_categ; col++)
        max_categ = (ncat[col] > max_categ)? ncat[col] : max_categ;

    if (model_outputs != NULL)
        ntry = std::min(ntry, ncols_numeric + ncols_categ);

    if (ncols_per_tree == 0)
        ncols_per_tree = ncols_numeric + ncols_categ;

    if (indexer != NULL && indexer->indices.empty())
        indexer = NULL;

    InputData<real_t, sparse_ix>
              input_data     = {numeric_data, ncols_numeric, categ_data, ncat, max_categ, ncols_categ,
                                nrows, ncols_numeric + ncols_categ, sample_weights,
                                false, col_weights,
                                Xc, Xc_ind, Xc_indptr,
                                0, 0, std::vector<double>(),
                                std::vector<char>(), 0, NULL,
                                (double*)NULL, (double*)NULL, (int*)NULL, std::vector<double>(),
                                std::vector<double>(), std::vector<double>(),
                                std::vector<size_t>(), std::vector<size_t>()};
    ModelParams model_params = {false, nrows, (size_t)1, ncols_per_tree,
                                max_depth? max_depth : (nrows - 1),
                                penalize_range, standardize_data, random_seed, weigh_by_kurt,
                                prob_pick_by_gain_avg, prob_pick_by_gain_pl,
                                prob_pick_by_full_gain, prob_pick_by_dens,
                                prob_pick_col_by_range, prob_pick_col_by_var,
                                prob_pick_col_by_kurt,
                                min_gain, cat_split_type, new_cat_action, missing_action,
                                (model_outputs != NULL)? model_outputs->scoring_metric : model_outputs_ext->scoring_metric,
                                fast_bratio, all_perm,
                                (model_outputs != NULL)? 0 : ndim, ntry,
                                coef_type, coef_by_prop, false, false, false, depth_imp, weigh_imp_rows, min_imp_obs};

    if (prob_pick_by_full_gain)
    {
        if (input_data.Xc_indptr == NULL)
            colmajor_to_rowmajor(input_data.numeric_data, input_data.nrows, input_data.ncols_numeric, input_data.X_row_major);
        else
            colmajor_to_rowmajor(input_data.Xc, input_data.Xc_ind, input_data.Xc_indptr,
                                 input_data.nrows, input_data.ncols_numeric,
                                 input_data.Xr, input_data.Xr_ind, input_data.Xr_indptr);
    }

    std::unique_ptr<WorkerMemory<ImputedData<sparse_ix, ldouble_safe>, ldouble_safe, real_t>> workspace(
        new WorkerMemory<ImputedData<sparse_ix, ldouble_safe>, ldouble_safe, real_t>()
    );

    size_t last_tree;
    bool added_tree = false;
    try
    {
        if (model_outputs != NULL)
        {
            last_tree = model_outputs->trees.size();
            model_outputs->trees.emplace_back();
            added_tree = true;
        }

        else
        {
            last_tree = model_outputs_ext->hplanes.size();
            model_outputs_ext->hplanes.emplace_back();
            added_tree = true;
        }

        if (imputer != NULL)
        {
            imputer->imputer_tree.emplace_back();
            impute_nodes = &(imputer->imputer_tree.back());
        }

        if (indexer != NULL)
        {
            indexer->indices.emplace_back();
        }

        SignalSwitcher ss = SignalSwitcher();
        check_interrupt_switch(ss);

        fit_itree<decltype(input_data), typename std::remove_pointer<decltype(workspace.get())>::type, ldouble_safe>(
                  (model_outputs != NULL)? &model_outputs->trees.back() : NULL,
                  (model_outputs_ext != NULL)? &model_outputs_ext->hplanes.back() : NULL,
                  *workspace,
                  input_data,
                  model_params,
                  impute_nodes,
                  last_tree);

        check_interrupt_switch(ss);

        if (model_outputs != NULL) {
            model_outputs->trees.back().shrink_to_fit();
            model_outputs->has_range_penalty = model_outputs->has_range_penalty || penalize_range;
        }
        else {
            model_outputs_ext->hplanes.back().shrink_to_fit();
            model_outputs_ext->has_range_penalty = model_outputs_ext->has_range_penalty || penalize_range;
        }

        if (imputer != NULL)
            imputer->imputer_tree.back().shrink_to_fit();

        if (indexer != NULL)
        {
            if (model_outputs != NULL)
                build_terminal_node_mappings_single_tree(indexer->indices.back().terminal_node_mappings,
                                                         indexer->indices.back().n_terminal,
                                                         model_outputs->trees.back());
            else
                build_terminal_node_mappings_single_tree(indexer->indices.back().terminal_node_mappings,
                                                         indexer->indices.back().n_terminal,
                                                         model_outputs_ext->hplanes.back());

            check_interrupt_switch(ss);


            if (!indexer->indices.front().node_distances.empty())
            {
                std::vector<size_t> temp;
                temp.reserve(indexer->indices.back().n_terminal);
                if (model_outputs != NULL) {
                    build_dindex(
                        temp,
                        indexer->indices.back().terminal_node_mappings,
                        indexer->indices.back().node_distances,
                        indexer->indices.back().node_depths,
                        indexer->indices.back().n_terminal,
                        model_outputs->trees.back()
                    );
                }
                else {
                    build_dindex(
                        temp,
                        indexer->indices.back().terminal_node_mappings,
                        indexer->indices.back().node_distances,
                        indexer->indices.back().node_depths,
                        indexer->indices.back().n_terminal,
                        model_outputs_ext->hplanes.back()
                    );
                }
            }

            check_interrupt_switch(ss);
            if (!indexer->indices.front().reference_points.empty())
            {
                size_t n_ref = indexer->indices.front().reference_points.size();
                std::vector<sparse_ix> terminal_indices(n_ref);
                std::unique_ptr<double[]> ignored(new double[n_ref]);
                if (model_outputs != NULL)
                {
                    IsoForest single_tree_model;
                    single_tree_model.new_cat_action = model_outputs->new_cat_action;
                    single_tree_model.cat_split_type = model_outputs->cat_split_type;
                    single_tree_model.missing_action = model_outputs->missing_action;
                    single_tree_model.trees.push_back(model_outputs->trees.back());

                    predict_iforest(ref_numeric_data, ref_categ_data,
                                    ref_is_col_major, ref_ld_numeric, ref_ld_categ,
                                    ref_Xc, ref_Xc_ind, ref_Xc_indptr,
                                    (real_t*)NULL, (sparse_ix*)NULL, (sparse_ix*)NULL,
                                    n_ref, 1, false,
                                    &single_tree_model, (ExtIsoForest*)NULL,
                                    ignored.get(), terminal_indices.data(),
                                    (double*)NULL,
                                    indexer);
                }

                else
                {
                    ExtIsoForest single_tree_model;
                    single_tree_model.new_cat_action = model_outputs_ext->new_cat_action;
                    single_tree_model.cat_split_type = model_outputs_ext->cat_split_type;
                    single_tree_model.missing_action = model_outputs_ext->missing_action;
                    single_tree_model.hplanes.push_back(model_outputs_ext->hplanes.back());

                    predict_iforest(ref_numeric_data, ref_categ_data,
                                    ref_is_col_major, ref_ld_numeric, ref_ld_categ,
                                    ref_Xc, ref_Xc_ind, ref_Xc_indptr,
                                    (real_t*)NULL, (sparse_ix*)NULL, (sparse_ix*)NULL,
                                    n_ref, 1, false,
                                    (IsoForest*)NULL, &single_tree_model,
                                    ignored.get(), terminal_indices.data(),
                                    (double*)NULL,
                                    indexer);
                }

                ignored.reset();
                indexer->indices.back().reference_points.assign(terminal_indices.begin(), terminal_indices.end());
                indexer->indices.back().reference_points.shrink_to_fit();
                build_ref_node(indexer->indices.back());
            }

            check_interrupt_switch(ss);
        }
    }

    catch (...)
    {
        if (added_tree)
        {
            if (model_outputs != NULL)
                model_outputs->trees.pop_back();
            else
                model_outputs_ext->hplanes.pop_back();
            if (imputer != NULL) {
                if (model_outputs != NULL)
                    imputer->imputer_tree.resize(model_outputs->trees.size());
                else
                    imputer->imputer_tree.resize(model_outputs_ext->hplanes.size());
            }
            if (indexer != NULL) {
                if (model_outputs != NULL)
                    indexer->indices.resize(model_outputs->trees.size());
                else
                    indexer->indices.resize(model_outputs_ext->hplanes.size());
            }
        }
        throw;
    }

    return EXIT_SUCCESS;
}